

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O2

void __thiscall deqp::ShaderRenderCase::setupDefaultInputs(ShaderRenderCase *this,int programID)

{
  pointer pTVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  uint uVar5;
  undefined4 extraout_var;
  long lVar7;
  NotSupportedError *pNVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  undefined4 uVar12;
  allocator<char> local_5d;
  undefined4 local_5c;
  ShaderRenderCase *local_58;
  string local_50;
  long lVar6;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  local_58 = this;
  setupDefaultUniforms(this->m_renderCtx,programID);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"post uniform setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderRenderCase.cpp"
                  ,0x20f);
  lVar10 = 0;
  lVar11 = 0;
  do {
    pTVar1 = (local_58->m_textures).
             super__Vector_base<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((int)(((long)(local_58->m_textures).
                     super__Vector_base<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x48) <= lVar11) {
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"texture sampler setup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderRenderCase.cpp"
                      ,0x251);
      return;
    }
    if (*(int *)((long)&pTVar1->m_type + lVar10) != 0) {
      uVar5 = (*local_58->m_renderCtx->_vptr_RenderContext[2])();
      iVar3 = *(int *)((long)&pTVar1->m_type + lVar10);
      if ((uVar5 & 0x3ff) == 2) {
        if (iVar3 == 4) {
          pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"3D texture binding is not supported",&local_5d);
          tcu::NotSupportedError::NotSupportedError(pNVar8,&local_50);
          __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        if (iVar3 == 3) {
          pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"2D array texture binding is not supported",&local_5d);
          tcu::NotSupportedError::NotSupportedError(pNVar8,&local_50);
          __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        if (*(int *)((long)&(pTVar1->m_sampler).compare + lVar10) != 0) {
          pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"Shadow lookups are not supported",&local_5d);
          tcu::NotSupportedError::NotSupportedError(pNVar8,&local_50);
          __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
      }
      if (iVar3 - 1U < 4) {
        switch(iVar3) {
        case 1:
          local_5c = 0;
          uVar9 = 0xde1;
          break;
        case 2:
          uVar9 = 0x8513;
          lVar7 = 0x178;
          local_5c = 0;
          goto LAB_00d775b7;
        case 3:
          uVar9 = 0x8c1a;
          local_5c = 0;
          break;
        case 4:
          uVar9 = 0x806f;
          local_5c = (undefined4)
                     CONCAT71((int7)((ulong)((long)&switchD_00d77575::switchdataD_017d8510 +
                                            (long)(int)(&switchD_00d77575::switchdataD_017d8510)
                                                       [iVar3 - 1U]) >> 8),1);
        }
        lVar7 = 0x68;
LAB_00d775b7:
        uVar12 = *(undefined4 *)(*(long *)((long)&pTVar1->m_binding + lVar10) + lVar7);
      }
      else {
        local_5c = 0;
        uVar9 = 0;
        uVar12 = 0;
      }
      (**(code **)(lVar6 + 8))((int)lVar11 + 0x84c0);
      (**(code **)(lVar6 + 0xb8))(uVar9,uVar12);
      pcVar2 = *(code **)(lVar6 + 0x1360);
      dVar4 = glu::getGLWrapMode(*(WrapMode *)((long)&(pTVar1->m_sampler).wrapS + lVar10));
      (*pcVar2)(uVar9,0x2802,dVar4);
      pcVar2 = *(code **)(lVar6 + 0x1360);
      dVar4 = glu::getGLWrapMode(*(WrapMode *)((long)&(pTVar1->m_sampler).wrapT + lVar10));
      (*pcVar2)(uVar9,0x2803,dVar4);
      pcVar2 = *(code **)(lVar6 + 0x1360);
      dVar4 = glu::getGLFilterMode(*(FilterMode *)((long)&(pTVar1->m_sampler).minFilter + lVar10));
      (*pcVar2)(uVar9,0x2801,dVar4);
      pcVar2 = *(code **)(lVar6 + 0x1360);
      dVar4 = glu::getGLFilterMode(*(FilterMode *)((long)&(pTVar1->m_sampler).magFilter + lVar10));
      (*pcVar2)(uVar9,0x2800,dVar4);
      if ((char)local_5c != '\0') {
        pcVar2 = *(code **)(lVar6 + 0x1360);
        dVar4 = glu::getGLWrapMode(*(WrapMode *)((long)&(pTVar1->m_sampler).wrapR + lVar10));
        (*pcVar2)(0x806f,0x8072,dVar4);
      }
      if (*(int *)((long)&(pTVar1->m_sampler).compare + lVar10) != 0) {
        (**(code **)(lVar6 + 0x1360))(uVar9,0x884c,0x884e);
        pcVar2 = *(code **)(lVar6 + 0x1360);
        dVar4 = glu::getGLCompareFunc(*(CompareMode *)((long)&(pTVar1->m_sampler).compare + lVar10))
        ;
        (*pcVar2)(uVar9,0x884d,dVar4);
      }
    }
    lVar11 = lVar11 + 1;
    lVar10 = lVar10 + 0x48;
  } while( true );
}

Assistant:

void ShaderRenderCase::setupDefaultInputs(int programID)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	// SETUP UNIFORMS.

	setupDefaultUniforms(m_renderCtx, programID);

	GLU_EXPECT_NO_ERROR(gl.getError(), "post uniform setup");

	// SETUP TEXTURES.

	for (int ndx = 0; ndx < (int)m_textures.size(); ndx++)
	{
		const TextureBinding& tex		= m_textures[ndx];
		const tcu::Sampler&   sampler   = tex.getSampler();
		deUint32			  texTarget = GL_NONE;
		deUint32			  texObj	= 0;

		if (tex.getType() == TextureBinding::TYPE_NONE)
			continue;

		// Feature check.
		if (m_renderCtx.getType().getAPI() == glu::ApiType(2, 0, glu::PROFILE_ES))
		{
			if (tex.getType() == TextureBinding::TYPE_2D_ARRAY)
				throw tcu::NotSupportedError("2D array texture binding is not supported");

			if (tex.getType() == TextureBinding::TYPE_3D)
				throw tcu::NotSupportedError("3D texture binding is not supported");

			if (sampler.compare != tcu::Sampler::COMPAREMODE_NONE)
				throw tcu::NotSupportedError("Shadow lookups are not supported");
		}

		switch (tex.getType())
		{
		case TextureBinding::TYPE_2D:
			texTarget = GL_TEXTURE_2D;
			texObj	= tex.get2D()->getGLTexture();
			break;
		case TextureBinding::TYPE_CUBE_MAP:
			texTarget = GL_TEXTURE_CUBE_MAP;
			texObj	= tex.getCube()->getGLTexture();
			break;
		case TextureBinding::TYPE_2D_ARRAY:
			texTarget = GL_TEXTURE_2D_ARRAY;
			texObj	= tex.get2DArray()->getGLTexture();
			break;
		case TextureBinding::TYPE_3D:
			texTarget = GL_TEXTURE_3D;
			texObj	= tex.get3D()->getGLTexture();
			break;
		default:
			DE_ASSERT(DE_FALSE);
		}

		gl.activeTexture(GL_TEXTURE0 + ndx);
		gl.bindTexture(texTarget, texObj);
		gl.texParameteri(texTarget, GL_TEXTURE_WRAP_S, glu::getGLWrapMode(sampler.wrapS));
		gl.texParameteri(texTarget, GL_TEXTURE_WRAP_T, glu::getGLWrapMode(sampler.wrapT));
		gl.texParameteri(texTarget, GL_TEXTURE_MIN_FILTER, glu::getGLFilterMode(sampler.minFilter));
		gl.texParameteri(texTarget, GL_TEXTURE_MAG_FILTER, glu::getGLFilterMode(sampler.magFilter));

		if (texTarget == GL_TEXTURE_3D)
			gl.texParameteri(texTarget, GL_TEXTURE_WRAP_R, glu::getGLWrapMode(sampler.wrapR));

		if (sampler.compare != tcu::Sampler::COMPAREMODE_NONE)
		{
			gl.texParameteri(texTarget, GL_TEXTURE_COMPARE_MODE, GL_COMPARE_REF_TO_TEXTURE);
			gl.texParameteri(texTarget, GL_TEXTURE_COMPARE_FUNC, glu::getGLCompareFunc(sampler.compare));
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "texture sampler setup");
}